

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

istream * spvtools::utils::
          ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                    (istream *is,bool negate_value,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  FloatProxy<double> this;
  bool bVar1;
  ulong uVar2;
  uint_type uVar3;
  FloatProxy<double> local_58;
  FloatProxy<double> local_50;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  local_48;
  uint_type local_40;
  uint_type local_38;
  FloatProxy<double> local_30;
  FloatProxy<double> val;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *value_local;
  bool negate_value_local;
  istream *is_local;
  
  val.data_ = (uint_type)value;
  bVar1 = RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                    (is,negate_value,value);
  if (!bVar1) {
    operator>>(is,&local_30);
    if (negate_value) {
      local_38 = (uint_type)FloatProxy<double>::operator-(&local_30);
      local_30 = (FloatProxy<double>)local_38;
    }
    local_40 = local_30.data_;
    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
    ::set_value((HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                 *)val.data_,local_30);
    uVar2 = std::ios::fail();
    if (((uVar2 & 1) != 0) &&
       (uVar3 = HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                ::getUnsignedBits((HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                                   *)val.data_), uVar3 == 0)) {
      FloatProxy<double>::FloatProxy(&local_50,0);
      HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
      ::HexFloat(&local_48,local_50);
      *(FloatProxy<double> *)val.data_ = local_48.value_.data_;
    }
    bVar1 = FloatProxy<double>::isInfinity(&local_30);
    this = val;
    if (bVar1) {
      bVar1 = HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
              ::isNegative((HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                            *)val.data_);
      if (bVar1 || negate_value) {
        local_58 = FloatProxy<double>::lowest();
      }
      else {
        local_58 = FloatProxy<double>::max();
      }
      HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
      ::set_value((HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                   *)this.data_,local_58);
      std::ios::setstate((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
    }
  }
  return is;
}

Assistant:

inline std::istream& ParseNormalFloat(std::istream& is, bool negate_value,
                                      HexFloat<T, Traits>& value) {
  if (RejectParseDueToLeadingSign(is, negate_value, value)) {
    return is;
  }
  T val;
  is >> val;
  if (negate_value) {
    val = -val;
  }
  value.set_value(val);
  // In the failure case, map -0.0 to 0.0.
  if (is.fail() && value.getUnsignedBits() == 0u) {
    value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
  }
  if (val.isInfinity()) {
    // Fail the parse.  Emulate standard behaviour by setting the value to
    // the closest normal value, and set the fail bit on the stream.
    value.set_value((value.isNegative() | negate_value) ? T::lowest()
                                                        : T::max());
    is.setstate(std::ios_base::failbit);
  }
  return is;
}